

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtApiPulse::callbackEvent(RtApiPulse *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined8 extraout_XMM0_Qa;
  char *local_a8;
  char *local_a0;
  string local_90 [32];
  string local_70 [32];
  ulong local_50;
  size_t bytes;
  char *pcStack_40;
  int pa_error;
  void *pulse_out;
  void *pulse_in;
  int doStopStream;
  RtAudioStreamStatus status;
  double streamTime;
  RtAudioCallback callback;
  PulseAudioHandle *pah;
  RtApiPulse *this_local;
  
  callback = (RtAudioCallback)(this->super_RtApi).stream_.apiHandle;
  pah = (PulseAudioHandle *)this;
  if ((this->super_RtApi).stream_.state == STREAM_STOPPED) {
    pthread_mutex_lock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
    while ((((byte)callback[0x48] ^ 0xff) & 1) != 0) {
      pthread_cond_wait((pthread_cond_t *)(callback + 0x18),
                        (pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
    }
    if ((this->super_RtApi).stream_.state != STREAM_RUNNING) {
      pthread_mutex_unlock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
      return;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
  }
  if ((this->super_RtApi).stream_.state == STREAM_CLOSED) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "RtApiPulse::callbackEvent(): the stream is closed ... this shouldn\'t happen!");
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
  }
  else {
    streamTime = (double)(this->super_RtApi).stream_.callbackInfo.callback;
    (*(this->super_RtApi)._vptr_RtApi[9])();
    pulse_in._4_4_ = 0;
    pulse_in._0_4_ =
         (*(code *)streamTime)
                   (extraout_XMM0_Qa,(this->super_RtApi).stream_.userBuffer[0],
                    (this->super_RtApi).stream_.userBuffer[1],(this->super_RtApi).stream_.bufferSize
                    ,0,(this->super_RtApi).stream_.callbackInfo.userData);
    if ((int)pulse_in == 2) {
      (*(this->super_RtApi)._vptr_RtApi[8])();
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
      if (((this->super_RtApi).stream_.doConvertBuffer[1] & 1U) == 0) {
        local_a0 = (this->super_RtApi).stream_.userBuffer[1];
      }
      else {
        local_a0 = (this->super_RtApi).stream_.deviceBuffer;
      }
      pulse_out = local_a0;
      if (((this->super_RtApi).stream_.doConvertBuffer[0] & 1U) == 0) {
        local_a8 = (this->super_RtApi).stream_.userBuffer[0];
      }
      else {
        local_a8 = (this->super_RtApi).stream_.deviceBuffer;
      }
      pcStack_40 = local_a8;
      if ((this->super_RtApi).stream_.state == STREAM_RUNNING) {
        if (((this->super_RtApi).stream_.mode == OUTPUT) ||
           ((this->super_RtApi).stream_.mode == DUPLEX)) {
          if (((this->super_RtApi).stream_.doConvertBuffer[0] & 1U) == 0) {
            uVar1 = (this->super_RtApi).stream_.nUserChannels[0];
            uVar2 = (this->super_RtApi).stream_.bufferSize;
            uVar3 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.userFormat);
            uVar3 = uVar1 * uVar2 * uVar3;
          }
          else {
            RtApi::convertBuffer
                      (&this->super_RtApi,(this->super_RtApi).stream_.deviceBuffer,
                       (this->super_RtApi).stream_.userBuffer[0],
                       (this->super_RtApi).stream_.convertInfo);
            uVar1 = (this->super_RtApi).stream_.nDeviceChannels[0];
            uVar2 = (this->super_RtApi).stream_.bufferSize;
            uVar3 = RtApi::formatBytes(&this->super_RtApi,
                                       (this->super_RtApi).stream_.deviceFormat[0]);
            uVar3 = uVar1 * uVar2 * uVar3;
          }
          local_50 = (ulong)uVar3;
          iVar4 = pa_simple_write(*(undefined8 *)callback,pcStack_40,local_50,(long)&bytes + 4);
          if (iVar4 < 0) {
            poVar5 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                     "RtApiPulse::callbackEvent: audio write error, ");
            pcVar6 = (char *)pa_strerror(bytes._4_4_);
            poVar5 = std::operator<<(poVar5,pcVar6);
            std::operator<<(poVar5,".");
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_70);
            std::__cxx11::string::~string(local_70);
            RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
          }
        }
        if (((this->super_RtApi).stream_.mode == INPUT) ||
           ((this->super_RtApi).stream_.mode == DUPLEX)) {
          if (((this->super_RtApi).stream_.doConvertBuffer[1] & 1U) == 0) {
            uVar1 = (this->super_RtApi).stream_.nUserChannels[1];
            uVar2 = (this->super_RtApi).stream_.bufferSize;
            uVar3 = RtApi::formatBytes(&this->super_RtApi,(this->super_RtApi).stream_.userFormat);
            uVar3 = uVar1 * uVar2 * uVar3;
          }
          else {
            uVar1 = (this->super_RtApi).stream_.nDeviceChannels[1];
            uVar2 = (this->super_RtApi).stream_.bufferSize;
            uVar3 = RtApi::formatBytes(&this->super_RtApi,
                                       (this->super_RtApi).stream_.deviceFormat[1]);
            uVar3 = uVar1 * uVar2 * uVar3;
          }
          local_50 = (ulong)uVar3;
          iVar4 = pa_simple_read(*(undefined8 *)(callback + 8),pulse_out,local_50,(long)&bytes + 4);
          if (iVar4 < 0) {
            poVar5 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                                     "RtApiPulse::callbackEvent: audio read error, ");
            pcVar6 = (char *)pa_strerror(bytes._4_4_);
            poVar5 = std::operator<<(poVar5,pcVar6);
            std::operator<<(poVar5,".");
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_90);
            std::__cxx11::string::~string(local_90);
            RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
          }
          if (((this->super_RtApi).stream_.doConvertBuffer[1] & 1U) != 0) {
            RtApi::convertBuffer
                      (&this->super_RtApi,(this->super_RtApi).stream_.userBuffer[1],
                       (this->super_RtApi).stream_.deviceBuffer,
                       (this->super_RtApi).stream_.convertInfo + 1);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
      RtApi::tickStreamTime(&this->super_RtApi);
      if ((int)pulse_in == 1) {
        (*(this->super_RtApi)._vptr_RtApi[7])();
      }
    }
  }
  return;
}

Assistant:

void RtApiPulse::callbackEvent( void )
{
  PulseAudioHandle *pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !pah->runnable )
      pthread_cond_wait( &pah->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiPulse::callbackEvent(): the stream is closed ... "
      "this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  int doStopStream = callback( stream_.userBuffer[OUTPUT], stream_.userBuffer[INPUT],
                               stream_.bufferSize, streamTime, status,
                               stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );
  void *pulse_in = stream_.doConvertBuffer[INPUT] ? stream_.deviceBuffer : stream_.userBuffer[INPUT];
  void *pulse_out = stream_.doConvertBuffer[OUTPUT] ? stream_.deviceBuffer : stream_.userBuffer[OUTPUT];

  if ( stream_.state != STREAM_RUNNING )
    goto unlock;

  int pa_error;
  size_t bytes;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    if ( stream_.doConvertBuffer[OUTPUT] ) {
        convertBuffer( stream_.deviceBuffer,
                       stream_.userBuffer[OUTPUT],
                       stream_.convertInfo[OUTPUT] );
        bytes = stream_.nDeviceChannels[OUTPUT] * stream_.bufferSize *
                formatBytes( stream_.deviceFormat[OUTPUT] );
    } else
        bytes = stream_.nUserChannels[OUTPUT] * stream_.bufferSize *
                formatBytes( stream_.userFormat );

    if ( pa_simple_write( pah->s_play, pulse_out, bytes, &pa_error ) < 0 ) {
      errorStream_ << "RtApiPulse::callbackEvent: audio write error, " <<
        pa_strerror( pa_error ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
    }
  }

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX) {
    if ( stream_.doConvertBuffer[INPUT] )
      bytes = stream_.nDeviceChannels[INPUT] * stream_.bufferSize *
        formatBytes( stream_.deviceFormat[INPUT] );
    else
      bytes = stream_.nUserChannels[INPUT] * stream_.bufferSize *
        formatBytes( stream_.userFormat );
            
    if ( pa_simple_read( pah->s_rec, pulse_in, bytes, &pa_error ) < 0 ) {
      errorStream_ << "RtApiPulse::callbackEvent: audio read error, " <<
        pa_strerror( pa_error ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
    }
    if ( stream_.doConvertBuffer[INPUT] ) {
      convertBuffer( stream_.userBuffer[INPUT],
                     stream_.deviceBuffer,
                     stream_.convertInfo[INPUT] );
    }
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );
  RtApi::tickStreamTime();

  if ( doStopStream == 1 )
    stopStream();
}